

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_AigGetLevelizedOrder(Abc_Ntk_t *pNtk,int fCollectCis)

{
  void **ppvVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *p_00;
  uint local_40;
  int i;
  int LevelMax;
  Abc_Obj_t **ppHead;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vLevels;
  Vec_Ptr_t *vNodes;
  int fCollectCis_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar3 = Abc_NtkIsStrash(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x72e,"Vec_Ptr_t *Abc_AigGetLevelizedOrder(Abc_Ntk_t *, int)");
  }
  Abc_NtkCleanCopy(pNtk);
  iVar3 = Abc_AigSetChoiceLevels(pNtk);
  p = Vec_PtrStart(iVar3 + 1);
  for (local_40 = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), (int)local_40 < iVar3;
      local_40 = local_40 + 1) {
    pObj = Abc_NtkObj(pNtk,local_40);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pObj), iVar3 != 0)) {
      ppvVar1 = p->pArray;
      aVar2 = pObj->field_6;
      (pObj->field_6).pCopy = (Abc_Obj_t *)ppvVar1[aVar2.iTemp];
      ppvVar1[aVar2.iTemp] = pObj;
    }
  }
  iVar3 = Abc_NtkNodeNum(pNtk);
  p_00 = Vec_PtrStart(iVar3);
  for (local_40 = (uint)((fCollectCis != 0 ^ 0xffU) & 1); iVar3 = Vec_PtrSize(p),
      (int)local_40 < iVar3; local_40 = local_40 + 1) {
    for (ppHead = (Abc_Obj_t **)Vec_PtrEntry(p,local_40); ppHead != (Abc_Obj_t **)0x0;
        ppHead = (Abc_Obj_t **)ppHead[8]) {
      Vec_PtrPush(p_00,ppHead);
    }
  }
  Vec_PtrFree(p);
  return p_00;
}

Assistant:

Vec_Ptr_t * Abc_AigGetLevelizedOrder( Abc_Ntk_t * pNtk, int fCollectCis )
{
    Vec_Ptr_t * vNodes, * vLevels;
    Abc_Obj_t * pNode, ** ppHead;
    int LevelMax, i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the correct levels
    Abc_NtkCleanCopy( pNtk );
    LevelMax = Abc_AigSetChoiceLevels( pNtk );
    // relink nodes by level
    vLevels = Vec_PtrStart( LevelMax + 1 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        ppHead = ((Abc_Obj_t **)vLevels->pArray) + (int)(ABC_PTRINT_T)pNode->pCopy;
        pNode->pCopy = *ppHead;
        *ppHead = pNode;
    }
    // recollect nodes
    vNodes = Vec_PtrStart( Abc_NtkNodeNum(pNtk) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vLevels, pNode, i, !fCollectCis )
        for ( ; pNode; pNode = pNode->pCopy )
            Vec_PtrPush( vNodes, pNode );
    Vec_PtrFree( vLevels );
    return vNodes;
}